

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

char * convert_charset_path(char *in_str,Charset from,char *out_str,Charset to)

{
  short sVar1;
  short *__src;
  long lVar2;
  short *psVar3;
  
  if ((in_str == (char *)0x0 || out_str == (char *)0x0) ||
     (__src = (short *)convert_charset(in_str,from,to), __src == (short *)0x0)) {
    g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
    out_str = (char *)0x0;
  }
  else {
    if (to == CS_UTF_16LE) {
      lVar2 = 0;
      psVar3 = __src;
      do {
        sVar1 = *psVar3;
        psVar3 = psVar3 + (sVar1 != 0);
        *(short *)(out_str + lVar2 * 2) = sVar1;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x103);
    }
    else {
      strncpy(out_str,(char *)__src,0x103);
    }
    free(__src);
  }
  return out_str;
}

Assistant:

char *convert_charset_path(const char *in_str, Charset from, char *out_str, Charset to)
{
	if (out_str == NULL || in_str == NULL)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return NULL;
	}
	char *temp = convert_charset(in_str, from, to);
	if (temp == NULL)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return NULL;
	}
	if (to == CS_UTF_16LE)
	{
		strncpyU16((char16_t *)out_str, (char16_t *)temp, MAX_PATH - 1);
	}
	else
	{
		strncpy(out_str, temp, MAX_PATH - 1);
	}
	free(temp);
	return out_str;
}